

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_delete.cpp
# Opt level: O3

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,DeleteStatement *stmt)

{
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *this_00;
  TableCatalogEntry *pTVar1;
  BoundStatement result;
  vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_> *pvVar2;
  optional_ptr<duckdb::Binder,_true> this_01;
  DeleteStatement *pDVar3;
  pointer pBVar4;
  BoundBaseTableRef *pBVar5;
  pointer this_02;
  LogicalGet *pLVar6;
  StatementProperties *pSVar7;
  Binder *pBVar8;
  tuple<duckdb::LogicalFilter_*,_std::default_delete<duckdb::LogicalFilter>_> this_03;
  pointer this_04;
  idx_t iVar9;
  __node_base this_05;
  pointer pLVar10;
  pointer pTVar11;
  BinderException *this_06;
  case_insensitive_map_t<shared_ptr<Binding>_> *pcVar12;
  _Hash_node_base *p_Var13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined1 in_stack_fffffffffffffcf8 [16];
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> in_stack_fffffffffffffd08;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var14;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  _Head_base<0UL,_duckdb::Expression_*,_false> in_stack_fffffffffffffd18;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var16;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var17;
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> _Var18;
  Binder *in_stack_fffffffffffffd20;
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [48];
  optional_ptr<duckdb::Binder,_true> local_288;
  Binder *local_280;
  __node_base local_278;
  optional_ptr<duckdb::ExpressionBinder,_true> local_270;
  __node_base local_268;
  __node_base local_260;
  __node_base local_258;
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> _Stack_250;
  ClientContext *local_248;
  __node_base _Stack_240;
  __uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_> local_238;
  Binder *pBStack_230;
  ClientContext *local_228;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_218;
  Binder *local_1f8;
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *local_1f0;
  __node_base local_1e8;
  TableCatalogEntry *local_1e0;
  DeleteStatement *local_1d8;
  BindContext *local_1d0;
  __node_base local_1c8;
  _Hash_node_base *local_1c0;
  shared_ptr<duckdb::Binder,_true> using_binder;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  __node_base local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  __node_base local_130;
  __node_base local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_120;
  BindContext local_110;
  
  local_238._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl =
       (tuple<duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
       (_Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)0x0;
  pBStack_230 = (Binder *)0x0;
  local_248 = (ClientContext *)0x0;
  _Stack_240._M_nxt = (_Hash_node_base *)0x0;
  local_258._M_nxt = (_Hash_node_base *)0x0;
  _Stack_250._M_head_impl = (BoundTableRef *)0x0;
  local_228 = (ClientContext *)0x0;
  this_00 = &stmt->table;
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*(this_00);
  Bind((Binder *)(local_2b8 + 0x28),(TableRef *)this);
  pBVar4 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
           operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                       *)(local_2b8 + 0x28));
  if (pBVar4->type == BASE_TABLE) {
    pBVar4 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
             operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                         *)(local_2b8 + 0x28));
    pBVar5 = BoundTableRef::Cast<duckdb::BoundBaseTableRef>(pBVar4);
    pTVar1 = pBVar5->table;
    unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
              ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                *)(local_2b8 + 0x28));
    CreatePlan((Binder *)&stack0xfffffffffffffd08,(BoundTableRef *)this);
    this_02 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)&stack0xfffffffffffffd08);
    pLVar6 = LogicalOperator::Cast<duckdb::LogicalGet>(this_02);
    if ((pTVar1->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.temporary == false) {
      pSVar7 = GetStatementProperties(this);
      StatementProperties::RegisterDBModify
                (pSVar7,(pTVar1->super_StandardEntry).super_InCatalogEntry.catalog,this->context);
    }
    AddCTEMap(this,&stmt->cte_map);
    p_Var13 = (_Hash_node_base *)
              (stmt->using_clauses).
              super_vector<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_1c8._M_nxt =
         (_Hash_node_base *)
         (stmt->using_clauses).
         super_vector<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_288.ptr = this;
    local_1f0 = this_00;
    local_1e8._M_nxt = (_Hash_node_base *)pLVar6;
    local_1e0 = pTVar1;
    local_1d8 = stmt;
    if (p_Var13 != local_1c8._M_nxt) {
      local_1d0 = &this->bind_context;
      in_stack_fffffffffffffd20 = (Binder *)0x0;
      local_1f8 = (Binder *)__return_storage_ptr__;
      do {
        CreateBinder((Binder *)&using_binder,(local_288.ptr)->context,local_288,REGULAR_BINDER);
        pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->(&using_binder);
        unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
                  ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                   p_Var13);
        Bind((Binder *)local_2b8,(TableRef *)pBVar8);
        unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
        operator*((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                   *)local_2b8);
        CreatePlan((Binder *)local_2d8,(BoundTableRef *)local_288.ptr);
        _Var17._M_head_impl = (Expression *)local_2d8._0_8_;
        if (in_stack_fffffffffffffd20 == (Binder *)0x0) {
          local_2d8._0_8_ =
               (__uniq_ptr_data<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true,_true>
                )0x0;
        }
        else {
          local_2b8._24_8_ = local_2d8._0_8_;
          local_2d8._0_8_ =
               (__uniq_ptr_data<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true,_true>
                )0x0;
          local_2b8._32_8_ = in_stack_fffffffffffffd20;
          LogicalCrossProduct::Create
                    ((LogicalCrossProduct *)&stack0xfffffffffffffd18,
                     (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)(local_2b8 + 0x20),
                     (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)(local_2b8 + 0x18));
          _Var16._M_head_impl = (Expression *)0x0;
          _Var17._M_head_impl = in_stack_fffffffffffffd18._M_head_impl;
          if ((Binder *)local_2b8._24_8_ != (Binder *)0x0) {
            (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_2b8._24_8_)->__weak_this_
                        ).internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal
                      .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi)();
            _Var17._M_head_impl = in_stack_fffffffffffffd18._M_head_impl;
          }
          in_stack_fffffffffffffd18._M_head_impl = _Var16._M_head_impl;
          local_2b8._24_8_ = (pointer)0x0;
          if ((ClientContext *)local_2b8._32_8_ != (ClientContext *)0x0) {
            (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_2b8._32_8_)->
                        __weak_this_).internal.
                        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)();
          }
          local_2b8._32_8_ = (_Hash_node_base *)0x0;
        }
        local_1c0 = p_Var13;
        pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->(&using_binder);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&local_110,&pBVar8->bind_context);
        local_110.binder = (pBVar8->bind_context).binder;
        local_110.bindings_list.
        super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pBVar8->bind_context).bindings_list.
             super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_110.bindings_list.
        super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pBVar8->bind_context).bindings_list.
             super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_110.bindings_list.
        super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pBVar8->bind_context).bindings_list.
             super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pBVar8->bind_context).bindings_list.
        super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pBVar8->bind_context).bindings_list.
        super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pBVar8->bind_context).bindings_list.
        super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_Hashtable(&local_110.using_columns._M_h,&(pBVar8->bind_context).using_columns);
        local_110.using_column_sets.
        super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pBVar8->bind_context).using_column_sets.
             super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_110.using_column_sets.
        super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pBVar8->bind_context).using_column_sets.
             super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_110.using_column_sets.
        super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pBVar8->bind_context).using_column_sets.
             super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pBVar8->bind_context).using_column_sets.
        super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pBVar8->bind_context).using_column_sets.
        super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pBVar8->bind_context).using_column_sets.
        super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pcVar12 = &(pBVar8->bind_context).cte_bindings;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_Hashtable(&local_110.cte_bindings._M_h,pcVar12,pcVar12);
        BindContext::AddContext(local_1d0,&local_110);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_110.cte_bindings._M_h);
        ::std::
        vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        ::~vector(&local_110.using_column_sets.
                   super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
                 );
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_110.using_columns._M_h);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        ::~vector(&local_110.bindings_list.
                   super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                 );
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&local_110);
        in_stack_fffffffffffffd20 = (Binder *)_Var17._M_head_impl;
        if ((tuple<duckdb::LogicalFilter_*,_std::default_delete<duckdb::LogicalFilter>_>)
            local_2d8._0_8_ != (_Head_base<0UL,_duckdb::LogicalFilter_*,_false>)0x0) {
          (**(code **)(*(long *)local_2d8._0_8_ + 8))();
          in_stack_fffffffffffffd20 = (Binder *)_Var17._M_head_impl;
        }
        p_Var13 = local_1c0;
        if ((element_type *)local_2b8._0_8_ != (element_type *)0x0) {
          (**(code **)&((_Head_base<0UL,_duckdb::BoundConstraint_*,_false> *)
                       &(((enable_shared_from_this<duckdb::Binder> *)local_2b8._0_8_)->__weak_this_)
                        .internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->_M_head_impl->type)();
        }
        if (using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (using_binder.internal.
                     super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        __return_storage_ptr__ = (BoundStatement *)local_1f8;
        p_Var13 = p_Var13 + 1;
      } while (p_Var13 != local_1c8._M_nxt);
      if (in_stack_fffffffffffffd20 != (Binder *)0x0) {
        _Var14._M_head_impl = (LogicalOperator *)0x0;
        local_268._M_nxt = (_Hash_node_base *)in_stack_fffffffffffffd20;
        local_260._M_nxt = (_Hash_node_base *)in_stack_fffffffffffffd08._M_head_impl;
        LogicalCrossProduct::Create
                  ((LogicalCrossProduct *)&using_binder,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_260,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_268);
        in_stack_fffffffffffffd08._M_head_impl =
             (LogicalOperator *)
             using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        if ((__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )_Var14._M_head_impl !=
            (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )0x0) {
          (**(code **)(*(long *)_Var14._M_head_impl + 8))();
          if (using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (element_type *)0x0) {
            (*(code *)((((using_binder.internal.
                          super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            )();
          }
        }
        using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        if ((Binder *)local_268._M_nxt != (Binder *)0x0) {
          (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)&(local_268._M_nxt)->_M_nxt)->
                      __weak_this_).internal.
                      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
        local_268._M_nxt = (_Hash_node_base *)0x0;
        if ((element_type *)local_260._M_nxt != (element_type *)0x0) {
          (*((LogicalOperator *)&(local_260._M_nxt)->_M_nxt)->_vptr_LogicalOperator[1])();
        }
        local_260._M_nxt = (_Hash_node_base *)0x0;
      }
    }
    pDVar3 = local_1d8;
    pTVar1 = local_1e0;
    this_01.ptr = local_288.ptr;
    _Var17._M_head_impl = (Expression *)0x0;
    if ((local_1d8->condition).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      WhereBinder::WhereBinder
                ((WhereBinder *)&using_binder,local_288.ptr,(local_288.ptr)->context,
                 (optional_ptr<duckdb::ColumnAliasBinder,_true>)0x0);
      ExpressionBinder::Bind
                ((ExpressionBinder *)local_2b8,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&using_binder,(optional_ptr<duckdb::LogicalType,_true>)&pDVar3->condition,false)
      ;
      _Var18._M_head_impl = (BoundTableRef *)local_2b8._0_8_;
      local_2b8._0_8_ =
           (tuple<duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)0x0;
      if ((_Head_base<0UL,_duckdb::Expression_*,_false>)_Var17._M_head_impl !=
          (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
        (*(code *)(((((weak_ptr<duckdb::ClientContext,_true> *)
                     &((_Var17._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->internal)
                    .super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)();
        if ((_Head_base<0UL,_duckdb::BoundTableRef_*,_false>)local_2b8._0_8_ !=
            (_Head_base<0UL,_duckdb::BoundTableRef_*,_false>)0x0) {
          (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_2b8._0_8_)->__weak_this_).
                      internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
      }
      PlanSubqueries(this_01.ptr,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&stack0xfffffffffffffd18,
                     (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)&stack0xfffffffffffffd08);
      this_03.
      super__Tuple_impl<0UL,_duckdb::LogicalFilter_*,_std::default_delete<duckdb::LogicalFilter>_>.
      super__Head_base<0UL,_duckdb::LogicalFilter_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::LogicalFilter_*,_std::default_delete<duckdb::LogicalFilter>_>)
           operator_new(0x80);
      _Var17._M_head_impl = (Expression *)0x0;
      local_2b8._0_8_ = _Var18._M_head_impl;
      LogicalFilter::LogicalFilter
                ((LogicalFilter *)
                 this_03.
                 super__Tuple_impl<0UL,_duckdb::LogicalFilter_*,_std::default_delete<duckdb::LogicalFilter>_>
                 .super__Head_base<0UL,_duckdb::LogicalFilter_*,_false>._M_head_impl,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_2b8);
      local_2d8._0_8_ =
           this_03.
           super__Tuple_impl<0UL,_duckdb::LogicalFilter_*,_std::default_delete<duckdb::LogicalFilter>_>
           .super__Head_base<0UL,_duckdb::LogicalFilter_*,_false>._M_head_impl;
      if ((BoundTableRef *)local_2b8._0_8_ != (BoundTableRef *)0x0) {
        (**(code **)((long)*(__uniq_ptr_data<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true,_true>
                             *)local_2b8._0_8_ + 8))();
      }
      this_04 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                              *)local_2d8);
      _Var14._M_head_impl = (LogicalOperator *)0x0;
      local_270.ptr = (ExpressionBinder *)in_stack_fffffffffffffd08._M_head_impl;
      LogicalOperator::AddChild
                (&this_04->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_270);
      if ((element_type *)local_270.ptr != (element_type *)0x0) {
        (*((LogicalOperator *)&(local_270.ptr)->_vptr_ExpressionBinder)->_vptr_LogicalOperator[1])()
        ;
      }
      in_stack_fffffffffffffd08._M_head_impl = (LogicalOperator *)local_2d8._0_8_;
      local_270.ptr = (ExpressionBinder *)0x0;
      local_2d8._0_8_ = (_Head_base<0UL,_duckdb::LogicalFilter_*,_false>)0x0;
      if ((tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
          _Var14._M_head_impl != (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                     &(_Var14._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
        if ((Binder *)local_2d8._0_8_ != (Binder *)0x0) {
          (*(code *)(((((weak_ptr<duckdb::Binder,_true> *)
                       &((LogicalOperator *)local_2d8._0_8_)->_vptr_LogicalOperator)->internal).
                      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
      }
      ExpressionBinder::~ExpressionBinder((ExpressionBinder *)&using_binder);
    }
    iVar9 = GenerateTableIndex(this_01.ptr);
    this_05._M_nxt = (_Hash_node_base *)operator_new(0x98);
    LogicalDelete::LogicalDelete((LogicalDelete *)this_05._M_nxt,pTVar1,iVar9);
    BindConstraints((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                     *)local_2b8,this_01.ptr,pTVar1);
    pLVar10 = unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>::
              operator->((unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>
                          *)&stack0xfffffffffffffd10);
    local_1a8[0]._0_8_ =
         (pLVar10->bound_constraints).
         super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pLVar10->bound_constraints).
    super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2b8._16_8_;
    using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (pLVar10->bound_constraints).
         super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (pLVar10->bound_constraints).
             super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (pLVar10->bound_constraints).
    super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2b8._0_8_;
    (pLVar10->bound_constraints).
    super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2b8._8_8_;
    local_2b8._0_8_ =
         (tuple<duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)0x0;
    local_2b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2b8._16_8_ = (ClientContext *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
               *)&using_binder);
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
               *)local_2b8);
    pLVar10 = unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>::
              operator->((unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>
                          *)&stack0xfffffffffffffd10);
    _Var14._M_head_impl = (LogicalOperator *)0x0;
    local_278._M_nxt = (_Hash_node_base *)in_stack_fffffffffffffd08._M_head_impl;
    LogicalOperator::AddChild
              (&pLVar10->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_278);
    if ((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
        local_278._M_nxt != (LogicalOperator *)0x0) {
      (*((LogicalOperator *)&(local_278._M_nxt)->_M_nxt)->_vptr_LogicalOperator[1])();
    }
    local_278._M_nxt = (__node_base_ptr)0x0;
    pBVar8 = (Binder *)&stack0xfffffffffffffd10;
    pLVar10 = unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>::
              operator->((unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>
                          *)pBVar8);
    BindRowIdColumns(pBVar8,pTVar1,(LogicalGet *)local_1e8._M_nxt,
                     &(pLVar10->super_LogicalOperator).expressions);
    if ((pDVar3->returning_list).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pDVar3->returning_list).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((vector<duckdb::DummyBinding,_true> *)local_258._M_nxt !=
          (vector<duckdb::DummyBinding,_true> *)0x0) {
        pvVar2 = (vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_> *)
                 &(local_258._M_nxt)->_M_nxt;
        local_258._M_nxt = this_05._M_nxt;
        (**(code **)&(((pvVar2->
                       super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>
                       )._M_impl.super__Vector_impl_data._M_start)->super_Binding).binding_type)();
        this_05._M_nxt = local_258._M_nxt;
      }
      local_258._M_nxt = this_05._M_nxt;
      using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1a8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&using_binder,"Count","");
      __l._M_len = 1;
      __l._M_array = (iterator)&using_binder;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2d8,__l,(allocator_type *)&stack0xfffffffffffffd07);
      local_2b8._16_8_ = local_228;
      local_2b8._8_8_ = pBStack_230;
      local_2b8._0_8_ =
           local_238._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
           .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
      local_228 = (ClientContext *)local_2d8._16_8_;
      local_238._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
      super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl =
           (tuple<duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
           (tuple<duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
           local_2d8._0_8_;
      pBStack_230 = (Binder *)local_2d8._8_8_;
      local_2d8._0_8_ =
           (__uniq_ptr_data<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true,_true>
            )0x0;
      local_2d8._8_8_ = (_Hash_node_base *)0x0;
      local_2d8._16_8_ = (ClientContext *)0x0;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2b8);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr != local_1a8) {
        operator_delete(using_binder.internal.
                        super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      LogicalType::LogicalType((LogicalType *)local_2d8,BIGINT);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_2d8;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_2b8,
                 __l_00,(allocator_type *)&stack0xfffffffffffffd07);
      local_1a8[0]._0_8_ = _Stack_240._M_nxt;
      using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248;
      using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Stack_250;
      _Stack_240._M_nxt = (_Hash_node_base *)local_2b8._16_8_;
      _Stack_250._M_head_impl = (BoundTableRef *)local_2b8._0_8_;
      local_248 = (ClientContext *)local_2b8._8_8_;
      local_2b8._0_8_ =
           (tuple<duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)0x0;
      local_2b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2b8._16_8_ = (ClientContext *)0x0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&using_binder)
      ;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_2b8);
      LogicalType::~LogicalType((LogicalType *)local_2d8);
      pSVar7 = GetStatementProperties(this_01.ptr);
      pSVar7->allow_stream_result = false;
      pSVar7->return_type = CHANGED_ROWS;
      (((tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> *)
       &(((Binder *)__return_storage_ptr__)->super_enable_shared_from_this<duckdb::Binder>).
        __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      ).super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
           (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)local_258._M_nxt;
      local_258._M_nxt = (_Hash_node_base *)0x0;
      (((Binder *)__return_storage_ptr__)->super_enable_shared_from_this<duckdb::Binder>).
      __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_250._M_head_impl;
      ((Binder *)__return_storage_ptr__)->context = local_248;
      (((Binder *)__return_storage_ptr__)->CTE_bindings)._M_h._M_buckets =
           &(_Stack_240._M_nxt)->_M_nxt;
      _Stack_240._M_nxt = (__node_base_ptr)0x0;
      _Stack_250._M_head_impl = (BoundTableRef *)0x0;
      local_248 = (ClientContext *)0x0;
      *(undefined4 *)&(((Binder *)__return_storage_ptr__)->CTE_bindings)._M_h._M_bucket_count =
           local_238._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
           .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl._0_4_;
      *(undefined4 *)
       ((long)&(((Binder *)__return_storage_ptr__)->CTE_bindings)._M_h._M_bucket_count + 4) =
           local_238._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
           .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl._4_4_;
      *(float *)&(((Binder *)__return_storage_ptr__)->CTE_bindings)._M_h._M_before_begin._M_nxt =
           pBStack_230._0_4_;
      *(undefined4 *)
       ((long)&(((Binder *)__return_storage_ptr__)->CTE_bindings)._M_h._M_before_begin._M_nxt + 4) =
           pBStack_230._4_4_;
      (((Binder *)__return_storage_ptr__)->CTE_bindings)._M_h._M_element_count =
           (size_type)local_228;
      local_228 = (ClientContext *)0x0;
      local_238._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
      super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl =
           (tuple<duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
           (_Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
           0x0;
      pBStack_230 = (Binder *)0x0;
    }
    else {
      pLVar10 = unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>
                              *)&stack0xfffffffffffffd10);
      pLVar10->return_chunk = true;
      iVar9 = GenerateTableIndex(this_01.ptr);
      pLVar10 = unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>
                              *)&stack0xfffffffffffffd10);
      pLVar10->table_index = iVar9;
      _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_218.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pDVar3->returning_list).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_218.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pDVar3->returning_list).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_218.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pDVar3->returning_list).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pDVar3->returning_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pDVar3->returning_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pDVar3->returning_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar11 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                operator->(local_1f0);
      local_148._M_nxt = local_258._M_nxt;
      local_258._M_nxt = (_Hash_node_base *)0x0;
      local_140._M_allocated_capacity = (size_type)_Stack_250._M_head_impl;
      local_140._8_8_ = local_248;
      local_130._M_nxt = _Stack_240._M_nxt;
      _Stack_250._M_head_impl = (BoundTableRef *)0x0;
      local_248 = (ClientContext *)0x0;
      _Stack_240._M_nxt = (__node_base_ptr)0x0;
      local_128._M_nxt =
           (_Hash_node_base *)
           local_238._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
           .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
      aStack_120._M_allocated_capacity = (size_type)pBStack_230;
      aStack_120._8_8_ = local_228;
      local_238._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
      super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl =
           (tuple<duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
           (_Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
           0x0;
      pBStack_230 = (Binder *)0x0;
      local_228 = (ClientContext *)0x0;
      result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffcf8._0_8_;
      result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffcf8._8_8_;
      result.plan.
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           &local_148;
      result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)_Var14._M_head_impl;
      result.names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var15._M_pi;
      result.names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Var17._M_head_impl;
      result.names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd20;
      local_280 = (Binder *)this_05._M_nxt;
      BindReturning(__return_storage_ptr__,this_01.ptr,
                    (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                     *)&local_218,pTVar1,&pTVar11->alias,iVar9,
                    (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                     )&local_280,result);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_128);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 local_140._M_local_buf);
      if ((DummyBinding *)local_148._M_nxt != (DummyBinding *)0x0) {
        (**(code **)&(((((_Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>
                          *)&((Binding *)&(local_148._M_nxt)->_M_nxt)->_vptr_Binding)->_M_impl).
                       super__Vector_impl_data._M_start)->super_Binding).binding_type)();
      }
      local_148._M_nxt = (_Hash_node_base *)0x0;
      if (local_280 != (Binder *)0x0) {
        (*((LogicalOperator *)&local_280->super_enable_shared_from_this<duckdb::Binder>)->
          _vptr_LogicalOperator[1])();
      }
      local_280 = (Binder *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector(&local_218);
    }
    if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(_Var15._M_pi)->_vptr__Sp_counted_base[1])();
    }
    if (_Var17._M_head_impl != (Expression *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)
                   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var17._M_head_impl)->
                    _vptr__Sp_counted_base)->__weak_this_).internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    if ((element_type *)_Var14._M_head_impl != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                   &(_Var14._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    if ((_Hash_node_base *)local_2b8._40_8_ != (_Hash_node_base *)0x0) {
      (*(code *)(*(_Hash_node_base **)local_2b8._40_8_)[1]._M_nxt)();
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_238);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&_Stack_250);
    if (local_258._M_nxt != (_Hash_node_base *)0x0) {
      (*(code *)(local_258._M_nxt)->_M_nxt[1]._M_nxt)();
    }
    return (BoundStatement *)(Binder *)__return_storage_ptr__;
  }
  this_06 = (BinderException *)__cxa_allocate_exception(0x10);
  using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1a8;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&using_binder,"Can only delete from base table!","");
  BinderException::BinderException(this_06,(string *)&using_binder);
  __cxa_throw(this_06,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BoundStatement Binder::Bind(DeleteStatement &stmt) {
	BoundStatement result;

	// visit the table reference
	auto bound_table = Bind(*stmt.table);
	if (bound_table->type != TableReferenceType::BASE_TABLE) {
		throw BinderException("Can only delete from base table!");
	}
	auto &table_binding = bound_table->Cast<BoundBaseTableRef>();
	auto &table = table_binding.table;

	auto root = CreatePlan(*bound_table);
	auto &get = root->Cast<LogicalGet>();
	D_ASSERT(root->type == LogicalOperatorType::LOGICAL_GET);

	if (!table.temporary) {
		// delete from persistent table: not read only!
		auto &properties = GetStatementProperties();
		properties.RegisterDBModify(table.catalog, context);
	}

	// Add CTEs as bindable
	AddCTEMap(stmt.cte_map);

	// plan any tables from the various using clauses
	if (!stmt.using_clauses.empty()) {
		unique_ptr<LogicalOperator> child_operator;
		for (auto &using_clause : stmt.using_clauses) {
			// bind the using clause
			auto using_binder = Binder::CreateBinder(context, this);
			auto bound_node = using_binder->Bind(*using_clause);
			auto op = CreatePlan(*bound_node);
			if (child_operator) {
				// already bound a child: create a cross product to unify the two
				child_operator = LogicalCrossProduct::Create(std::move(child_operator), std::move(op));
			} else {
				child_operator = std::move(op);
			}
			bind_context.AddContext(std::move(using_binder->bind_context));
		}
		if (child_operator) {
			root = LogicalCrossProduct::Create(std::move(root), std::move(child_operator));
		}
	}

	// project any additional columns required for the condition
	unique_ptr<Expression> condition;
	if (stmt.condition) {
		WhereBinder binder(*this, context);
		condition = binder.Bind(stmt.condition);

		PlanSubqueries(condition, root);
		auto filter = make_uniq<LogicalFilter>(std::move(condition));
		filter->AddChild(std::move(root));
		root = std::move(filter);
	}
	// create the delete node
	auto del = make_uniq<LogicalDelete>(table, GenerateTableIndex());
	del->bound_constraints = BindConstraints(table);
	del->AddChild(std::move(root));

	// bind the row id columns and add them to the projection list
	BindRowIdColumns(table, get, del->expressions);

	if (!stmt.returning_list.empty()) {
		del->return_chunk = true;

		auto update_table_index = GenerateTableIndex();
		del->table_index = update_table_index;

		unique_ptr<LogicalOperator> del_as_logicaloperator = std::move(del);
		return BindReturning(std::move(stmt.returning_list), table, stmt.table->alias, update_table_index,
		                     std::move(del_as_logicaloperator), std::move(result));
	}
	result.plan = std::move(del);
	result.names = {"Count"};
	result.types = {LogicalType::BIGINT};

	auto &properties = GetStatementProperties();
	properties.allow_stream_result = false;
	properties.return_type = StatementReturnType::CHANGED_ROWS;

	return result;
}